

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O1

void __thiscall kj::UnixEventPort::~UnixEventPort(UnixEventPort *this)

{
  ChildSet *ptrCopy;
  
  (this->super_EventPort)._vptr_EventPort = (_func_int **)&PTR_wait_00645a68;
  (this->super_SleepHooks)._vptr_SleepHooks = (_func_int **)&DAT_00645aa8;
  if ((this->childSet).ptr.ptr != (ChildSet *)0x0) {
    (anonymous_namespace)::threadClaimedChildExits = 0;
    (this->childSet).ptr.ptr = (ChildSet *)0x0;
    (**((this->childSet).ptr.disposer)->_vptr_Disposer)();
  }
  if ((this->timerFd).ptr.isSet == true) {
    OwnFd::~OwnFd(&(this->timerFd).ptr.field_1.value);
  }
  OwnFd::~OwnFd(&this->eventFd);
  OwnFd::~OwnFd(&this->epollFd);
  TimerImpl::~TimerImpl(&this->timerImpl);
  return;
}

Assistant:

UnixEventPort::~UnixEventPort() noexcept(false) {
  if (childSet != kj::none) {
    // We had claimed the exclusive right to call onChildExit(). Release that right.
    threadClaimedChildExits = false;
  }
}